

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O3

string * httplib::detail::decode_url(string *__return_storage_ptr__,string *s)

{
  char cVar1;
  pointer pcVar2;
  byte bVar3;
  uint uVar4;
  ulong uVar5;
  long lVar6;
  int iVar7;
  uint uVar8;
  char cVar9;
  ulong uVar10;
  char buff [4];
  byte local_2c;
  byte local_2b;
  byte local_2a;
  byte local_29;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  uVar5 = s->_M_string_length;
  if (uVar5 != 0) {
    uVar10 = 0;
    do {
      pcVar2 = (s->_M_dataplus)._M_p;
      cVar9 = (char)__return_storage_ptr__;
      if (((pcVar2[uVar10] == '+') || (pcVar2[uVar10] != '%')) || (uVar5 <= uVar10 + 1)) {
        std::__cxx11::string::push_back(cVar9);
      }
      else if (pcVar2[uVar10 + 1] == 'u') {
        if (uVar10 + 2 < uVar5) {
          lVar6 = 0;
          uVar4 = 0;
          do {
            cVar1 = pcVar2[lVar6 + uVar10 + 2];
            iVar7 = (int)cVar1;
            if (cVar1 == '\0') goto LAB_00146e95;
            uVar8 = iVar7 - 0x30;
            if (cVar1 < ' ' || 9 < uVar8) {
              if ((byte)(cVar1 + 0xbfU) < 6) {
                uVar8 = iVar7 - 0x37;
              }
              else {
                if (5 < (byte)(cVar1 + 0x9fU)) goto LAB_00146e95;
                uVar8 = iVar7 - 0x57;
              }
            }
            uVar4 = uVar4 * 0x10 + uVar8;
            lVar6 = lVar6 + 1;
          } while (lVar6 != 4);
          bVar3 = (byte)uVar4;
          if ((int)uVar4 < 0x80) {
            local_2c = bVar3 & 0x7f;
LAB_00146f0a:
            std::__cxx11::string::append((char *)__return_storage_ptr__,(ulong)&local_2c);
          }
          else {
            if (uVar4 < 0x800) {
              local_2c = (byte)(uVar4 >> 6) | 0xc0;
              local_2b = bVar3 & 0x3f | 0x80;
              goto LAB_00146f0a;
            }
            if (uVar4 < 0xd800) {
LAB_00146ee2:
              local_2c = (byte)(uVar4 >> 0xc) | 0xe0;
              local_2b = (byte)(uVar4 >> 6) & 0x3f | 0x80;
              local_2a = bVar3 & 0x3f | 0x80;
              goto LAB_00146f0a;
            }
            if (0xdfff < uVar4) {
              if (uVar4 < 0x10000) goto LAB_00146ee2;
              if (uVar4 < 0x110000) {
                local_2c = (byte)(uVar4 >> 0x12) | 0xf0;
                local_2b = (byte)(uVar4 >> 0xc) & 0x3f | 0x80;
                local_2a = (byte)(uVar4 >> 6) & 0x3f | 0x80;
                local_29 = bVar3 & 0x3f | 0x80;
                goto LAB_00146f0a;
              }
            }
          }
          uVar10 = uVar10 + 5;
        }
        else {
LAB_00146e95:
          std::__cxx11::string::push_back(cVar9);
        }
      }
      else {
        lVar6 = 0;
        do {
          cVar1 = pcVar2[lVar6 + uVar10 + 1];
          if ((cVar1 == '\0') ||
             (((cVar1 < ' ' || 9 < (int)cVar1 - 0x30U && (5 < (byte)(cVar1 + 0xbfU))) &&
              (5 < (byte)(cVar1 + 0x9fU))))) {
            std::__cxx11::string::push_back(cVar9);
            goto LAB_00146e1c;
          }
          lVar6 = lVar6 + 1;
        } while (lVar6 != 2);
        std::__cxx11::string::push_back(cVar9);
        uVar10 = uVar10 + 2;
      }
LAB_00146e1c:
      uVar10 = uVar10 + 1;
      uVar5 = s->_M_string_length;
    } while (uVar10 < uVar5);
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::string decode_url(const std::string& s)
{
    std::string result;

    for (size_t i = 0; i < s.size(); i++) {
        if (s[i] == '%' && i + 1 < s.size()) {
            if (s[i + 1] == 'u') {
                int val = 0;
                if (from_hex_to_i(s, i + 2, 4, val)) {
                    // 4 digits Unicode codes
                    char buff[4];
                    size_t len = to_utf8(val, buff);
                    if (len > 0) {
                        result.append(buff, len);
                    }
                    i += 5; // 'u0000'
                } else {
                    result += s[i];
                }
            } else {
                int val = 0;
                if (from_hex_to_i(s, i + 1, 2, val)) {
                    // 2 digits hex codes
                    result += val;
                    i += 2; // '00'
                } else {
                    result += s[i];
                }
            }
        } else if (s[i] == '+') {
            result += ' ';
        } else {
            result += s[i];
        }
    }

    return result;
}